

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory.cpp
# Opt level: O0

int __thiscall xmrig::VirtualMemory::init(VirtualMemory *this,EVP_PKEY_CTX *ctx)

{
  undefined1 hugePages;
  int iVar1;
  ICpuInfo *pIVar2;
  undefined4 extraout_var;
  void *pvVar3;
  undefined4 extraout_var_00;
  NUMAMemoryPool *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  MemoryPool *in_stack_ffffffffffffffd0;
  VirtualMemory *size;
  
  hugePages = (byte)ctx & 1;
  if (pool == (void *)0x0) {
    osInit((bool)hugePages);
  }
  pIVar2 = Cpu::info();
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])();
  if (CONCAT44(extraout_var,iVar1) < 2) {
    pvVar3 = operator_new(0x20);
    MemoryPool::MemoryPool
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0),(uint32_t)in_stack_ffffffffffffffc0
              );
    pool = pvVar3;
  }
  else {
    pvVar3 = operator_new(0x50);
    size = this;
    pIVar2 = Cpu::info();
    iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])();
    align((size_t)this,CONCAT44(extraout_var_00,iVar1));
    NUMAMemoryPool::NUMAMemoryPool(unaff_retaddr,(size_t)size,(bool)hugePages);
    pool = pvVar3;
  }
  return (int)pool;
}

Assistant:

void xmrig::VirtualMemory::init(size_t poolSize, bool hugePages)
{
    if (!pool) {
        osInit(hugePages);
    }

#   ifdef XMRIG_FEATURE_HWLOC
    if (Cpu::info()->nodes() > 1) {
        pool = new NUMAMemoryPool(align(poolSize, Cpu::info()->nodes()), hugePages);
    } else
#   endif
    {
        pool = new MemoryPool(poolSize, hugePages);
    }
}